

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDerivedProfileDef::~IfcDerivedProfileDef(IfcDerivedProfileDef *this)

{
  Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pMVar1;
  undefined1 *puVar2;
  LazyObject *pLVar3;
  size_type *psVar4;
  
  *(undefined8 *)&this[-1].super_IfcProfileDef.field_0x60 = 0x8ce970;
  *(undefined8 *)((long)&(this->super_IfcProfileDef).ProfileName.ptr.field_2 + 8) = 0x8ce9c0;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8ce998;
  puVar2 = *(undefined1 **)
            &(this->super_IfcProfileDef).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20;
  pMVar1 = &(this->super_IfcProfileDef).ProfileName;
  if ((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      puVar2 != pMVar1) {
    operator_delete(puVar2,(ulong)((pMVar1->ptr)._M_dataplus._M_p + 1));
  }
  *(undefined8 *)&this[-1].super_IfcProfileDef.field_0x60 = 0x8ce9e8;
  *(undefined8 *)((long)&(this->super_IfcProfileDef).ProfileName.ptr.field_2 + 8) = 0x8cea10;
  puVar2 = *(undefined1 **)((long)&this[-1].Label.ptr.field_2 + 8);
  if (puVar2 != &this[-1].field_0xa0) {
    operator_delete(puVar2,*(long *)&this[-1].field_0xa0 + 1);
  }
  pLVar3 = this[-1].Operator.obj;
  psVar4 = &this[-1].Label.ptr._M_string_length;
  if (pLVar3 != (LazyObject *)psVar4) {
    operator_delete(pLVar3,*psVar4 + 1);
  }
  operator_delete(&this[-1].super_IfcProfileDef.field_0x60,0xb8);
  return;
}

Assistant:

IfcDerivedProfileDef() : Object("IfcDerivedProfileDef") {}